

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O1

ssize_t __thiscall LASindex::write(LASindex *this,int __fd,void *__buf,size_t __n)

{
  long *plVar1;
  ulong uVar2;
  void *__buf_00;
  undefined4 in_register_00000034;
  
  if (CONCAT44(in_register_00000034,__fd) != 0) {
    plVar1 = (long *)operator_new(0x28);
    plVar1[1] = 0;
    *(undefined4 *)(plVar1 + 2) = 0;
    plVar1[3] = CONCAT44(in_register_00000034,__fd);
    *plVar1 = (long)&PTR_putByte_0015e3f0;
    plVar1[4] = 0;
    uVar2 = write(this,(int)plVar1,__buf_00,0x15e3f0);
    (**(code **)(*plVar1 + 0x68))(plVar1);
    return uVar2 & 0xffffffff;
  }
  return 0;
}

Assistant:

BOOL LASindex::write(FILE* file) const
{
  if (file == 0) return FALSE;
  ByteStreamOut* stream;
  if (IS_LITTLE_ENDIAN())
    stream = new ByteStreamOutFileLE(file);
  else
    stream = new ByteStreamOutFileBE(file);
  if (!write(stream))
  {
    delete stream;
    return FALSE;
  }
  delete stream;
  return TRUE;
}